

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O3

void __thiscall PressDelayHandler::pressed(PressDelayHandler *this,QEvent *e,int delay)

{
  QMouseEvent *pQVar1;
  Data *pDVar2;
  bool bVar3;
  MouseEventSource MVar4;
  QMouseEvent *pQVar5;
  QWidget *pQVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  double dVar8;
  undefined1 auVar9 [16];
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->pressDelayEvent).d == (QMouseEvent *)0x0) {
    pQVar5 = copyMouseEvent(e);
    pQVar1 = (this->pressDelayEvent).d;
    if ((pQVar1 != pQVar5) && ((this->pressDelayEvent).d = pQVar5, pQVar1 != (QMouseEvent *)0x0)) {
      (**(code **)(*(long *)pQVar1 + 8))();
    }
    QBasicTimer::start(&this->pressDelayTimer,(long)delay * 1000000,1,this);
    auVar9 = QEventPoint::globalPosition();
    dVar8 = (double)((ulong)auVar9._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._0_8_;
    bVar3 = 2147483647.0 < dVar8;
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    local_30.xp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar8);
    dVar8 = (double)((ulong)auVar9._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar9._8_8_;
    bVar3 = 2147483647.0 < dVar8;
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    local_30.yp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar8);
    pQVar6 = QApplication::widgetAt(&local_30);
    if (pQVar6 == (QWidget *)0x0) {
      pDVar7 = (Data *)0x0;
    }
    else {
      pDVar7 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar6->super_QObject);
    }
    pDVar2 = (this->mouseTarget).wp.d;
    (this->mouseTarget).wp.d = pDVar7;
    (this->mouseTarget).wp.value = &pQVar6->super_QObject;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
    }
    this->mouseButton = *(MouseButton *)((this->pressDelayEvent).d + 0x40);
    MVar4 = QMouseEvent::source();
    this->mouseEventSource = MVar4;
  }
  (**(code **)(*(long *)e + 0x10))(e,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pressed(QEvent *e, int delay)
    {
        if (!pressDelayEvent) {
            pressDelayEvent.reset(copyMouseEvent(e));
            using namespace std::chrono_literals;
            pressDelayTimer.start(delay * 1ms, this);
            mouseTarget = QApplication::widgetAt(pressDelayEvent->globalPosition().toPoint());
            mouseButton = pressDelayEvent->button();
            mouseEventSource = pressDelayEvent->source();
            qFGDebug("QFG: consuming/delaying mouse press");
        } else {
            qFGDebug("QFG: NOT consuming/delaying mouse press");
        }
        e->setAccepted(true);
    }